

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O0

void __thiscall
Centaurus::Stage1Runner::Stage1Runner
          (Stage1Runner *this,char *filename,IParser *parser,size_t bank_size,int bank_num,
          bool is_dry,bool is_result_captured)

{
  int pid;
  bool is_result_captured_local;
  bool is_dry_local;
  int bank_num_local;
  size_t bank_size_local;
  IParser *parser_local;
  char *filename_local;
  Stage1Runner *this_local;
  
  pid = get_current_pid();
  BaseRunner::BaseRunner(&this->super_BaseRunner,filename,bank_size,bank_num,pid);
  (this->super_BaseRunner).super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__Stage1Runner_002c1118;
  this->m_parser = parser;
  this->is_dry = is_dry;
  this->is_result_captured = is_result_captured;
  std::
  vector<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
  ::vector(&this->result_chunks_);
  BaseRunner::acquire_memory(&this->super_BaseRunner,true);
  BaseRunner::create_semaphore(&this->super_BaseRunner);
  return;
}

Assistant:

Stage1Runner(const char *filename, IParser *parser, size_t bank_size, int bank_num, bool is_dry=false, bool is_result_captured=false)
    : BaseRunner(filename, bank_size, bank_num), m_parser(parser), is_dry(is_dry), is_result_captured(is_result_captured)
  {
    acquire_memory(true);
    create_semaphore();
  }